

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_write.cpp
# Opt level: O3

void __thiscall UniValue::writeArray(UniValue *this,uint prettyIndent,uint indentLevel,string *s)

{
  long lVar1;
  int iVar2;
  ulong uVar4;
  void *__buf;
  ulong uVar5;
  bool bVar6;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  pointer pUVar3;
  
  std::__cxx11::string::append((char *)s);
  if (prettyIndent != 0) {
    std::__cxx11::string::append((char *)s);
  }
  pUVar3 = (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish != pUVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      iVar2 = (int)pUVar3;
      if (prettyIndent == 0) {
        __buf = (void *)0x0;
      }
      else {
        __buf = (void *)(ulong)prettyIndent;
        if ((indentLevel | prettyIndent) < 0x100) {
          std::__cxx11::string::_M_replace_aux
                    ((ulong)s,s->_M_string_length,0,(char)indentLevel * (char)prettyIndent);
          iVar2 = (int)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        }
      }
      write_abi_cxx11_((UniValue *)local_50,(int)uVar4 * 0x58 + iVar2,__buf,(ulong)(indentLevel + 1)
                      );
      std::__cxx11::string::_M_append((char *)s,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (((long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3 - 1U != uVar4) {
        std::__cxx11::string::append((char *)s);
      }
      if (prettyIndent != 0) {
        std::__cxx11::string::append((char *)s);
      }
      pUVar3 = (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pUVar3 >> 3) * 0x2e8ba2e8ba2e8ba3;
      bVar6 = uVar5 <= uVar4;
      lVar1 = uVar4 - uVar5;
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar6 && lVar1 != 0);
  }
  if ((prettyIndent != 0) && ((indentLevel - 1 | prettyIndent) < 0x100)) {
    std::__cxx11::string::_M_replace_aux
              ((ulong)s,s->_M_string_length,0,(char)(indentLevel - 1) * (char)prettyIndent);
  }
  std::__cxx11::string::append((char *)s);
  return;
}

Assistant:

void UniValue::writeArray(unsigned int prettyIndent, unsigned int indentLevel, std::string& s) const
{
    s += "[";
    if (prettyIndent)
        s += "\n";

    for (unsigned int i = 0; i < values.size(); i++) {
        if (prettyIndent)
            indentStr(prettyIndent, indentLevel, s);
        s += values[i].write(prettyIndent, indentLevel + 1);
        if (i != (values.size() - 1)) {
            s += ",";
        }
        if (prettyIndent)
            s += "\n";
    }

    if (prettyIndent)
        indentStr(prettyIndent, indentLevel - 1, s);
    s += "]";
}